

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O3

void __thiscall
duckdb::NestedLoopJoinLocalState::NestedLoopJoinLocalState
          (NestedLoopJoinLocalState *this,ClientContext *context,
          vector<duckdb::JoinCondition,_true> *conditions)

{
  pointer pJVar1;
  vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_> *pvVar2;
  type expr;
  pointer pEVar3;
  Allocator *allocator;
  JoinCondition *cond;
  pointer pJVar4;
  vector<duckdb::LogicalType,_true> condition_types;
  vector<duckdb::LogicalType,_true> local_58;
  ClientContext *local_38;
  
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.batch_index.index + 4) =
       0xffffffff;
  *(undefined4 *)&(this->super_LocalSinkState).partition_info.min_batch_index.index = 0xffffffff;
  *(undefined4 *)((long)&(this->super_LocalSinkState).partition_info.min_batch_index.index + 4) =
       0xffffffff;
  pvVar2 = &(this->super_LocalSinkState).partition_info.partition_data.
            super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_LocalSinkState).partition_info.partition_data.
           super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
           super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_LocalSinkState)._vptr_LocalSinkState =
       (_func_int **)&PTR__NestedLoopJoinLocalState_01994ee8;
  DataChunk::DataChunk(&this->right_condition);
  local_38 = context;
  ExpressionExecutor::ExpressionExecutor(&this->rhs_executor,context);
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pJVar4 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pJVar1 = (conditions->super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>)
           .super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pJVar4 != pJVar1) {
    do {
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(&pJVar4->right);
      ExpressionExecutor::AddExpression(&this->rhs_executor,expr);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&pJVar4->right);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58,
                 &pEVar3->return_type);
      pJVar4 = pJVar4 + 1;
    } while (pJVar4 != pJVar1);
  }
  allocator = Allocator::Get(local_38);
  DataChunk::Initialize(&this->right_condition,allocator,&local_58,0x800);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58);
  return;
}

Assistant:

explicit NestedLoopJoinLocalState(ClientContext &context, const vector<JoinCondition> &conditions)
	    : rhs_executor(context) {
		vector<LogicalType> condition_types;
		for (auto &cond : conditions) {
			rhs_executor.AddExpression(*cond.right);
			condition_types.push_back(cond.right->return_type);
		}
		right_condition.Initialize(Allocator::Get(context), condition_types);
	}